

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FieldDescriptor FVar3;
  Type TVar4;
  FieldDescriptor *pFVar5;
  Descriptor *descriptor;
  long *plVar6;
  size_type *psVar7;
  BytesMode in_R8D;
  undefined1 in_R9B;
  string value_to_object;
  string local_88;
  string local_68;
  string local_48;
  
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_88,(_anonymous_namespace_ *)field,(GeneratorOptions *)printer,field);
  io::Printer::Print(printer,"$fieldname$: ","fieldname",&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    pFVar5 = anon_unknown_0::MapFieldValue(field);
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
    TVar4 = FieldDescriptor::type(pFVar5);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
      descriptor = FieldDescriptor::message_type(pFVar5);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,descriptor);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68.field_2._8_8_ = plVar6[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_68._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      in_R8D = 9;
      std::__cxx11::string::_M_replace
                ((ulong)&local_88,0,(char *)local_88._M_string_length,0x3569f6);
    }
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    io::Printer::Print(printer,
                       "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) : []",
                       "name",&local_68,"valuetoobject",&local_88);
  }
  else {
    TVar4 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) != 10) {
      pFVar5 = field;
      TVar4 = FieldDescriptor::type(field);
      if (TVar4 != TYPE_BYTES) {
        FVar3 = field[0x98];
        if (*(int *)(*(long *)(field + 0x30) + 0x8c) == 3) {
          FVar3 = (FieldDescriptor)((byte)FVar3 | *(int *)(field + 0x4c) != 3);
        }
        GenerateFieldValueExpression
                  ((Generator *)pFVar5,printer,"msg",field,(bool)((byte)FVar3 & 1));
        return;
      }
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_88,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x1,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      io::Printer::Print(printer,"msg.get$getter$()","getter",&local_88);
      goto LAB_00221c5b;
    }
    if (*(int *)(field + 0x4c) == 3) {
      pFVar5 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_88,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_68,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar5);
      io::Printer::Print(printer,
                         "jspb.Message.toObjectList(msg.get$getter$(),\n    $type$.toObject, includeInstance)"
                         ,"getter",&local_88,"type",&local_68);
    }
    else {
      pFVar5 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_88,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_68,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar5);
      io::Printer::Print(printer,"(f = msg.get$getter$()) && $type$.toObject(includeInstance, f)",
                         "getter",&local_88,"type",&local_68);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_00221c5b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldToObject(const GeneratorOptions& options,
                                           io::Printer* printer,
                                           const FieldDescriptor* field) const {
  printer->Print("$fieldname$: ",
                 "fieldname", JSObjectFieldName(options, field));

  if (IsMap(options, field)) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    // If the map values are of a message type, we must provide their static
    // toObject() method; otherwise we pass undefined for that argument.
    string value_to_object;
    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      value_to_object =
          GetMessagePath(options, value_field->message_type()) + ".toObject";
    } else {
      value_to_object = "undefined";
    }
    printer->Print(
        "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) "
        ": []",
        "name", JSGetterName(options, field), "valuetoobject", value_to_object);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field.
    if (field->is_repeated()) {
      {
        printer->Print("jspb.Message.toObjectList(msg.get$getter$(),\n"
                       "    $type$.toObject, includeInstance)",
                       "getter", JSGetterName(options, field),
                       "type", SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print("(f = msg.get$getter$()) && "
                     "$type$.toObject(includeInstance, f)",
                     "getter", JSGetterName(options, field),
                     "type", SubmessageTypeRef(options, field));
    }
  } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
    // For bytes fields we want to always return the B64 data.
    printer->Print("msg.get$getter$()",
                   "getter", JSGetterName(options, field, BYTES_B64));
  } else {
    bool use_default = field->has_default_value();

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        // Repeated fields get initialized to their default in the constructor
        // (why?), so we emit a plain getField() call for them.
        !field->is_repeated() && !UseBrokenPresenceSemantics(options, field)) {
      // Proto3 puts all defaults (including implicit defaults) in toObject().
      // But for proto2 we leave the existing semantics unchanged: unset fields
      // without default are unset.
      use_default = true;
    }

    // We don't implement this by calling the accessors, because the semantics
    // of the accessors are changing independently of the toObject() semantics.
    // We are migrating the accessors to return defaults instead of null, but
    // it may take longer to migrate toObject (or we might not want to do it at
    // all).  So we want to generate independent code.
    GenerateFieldValueExpression(printer, "msg", field, use_default);
  }
}